

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net_tsqueue.h
# Opt level: O1

void __thiscall
blcl::net::tsqueue<blcl::net::owned_message<MsgType>_>::clear
          (tsqueue<blcl::net::owned_message<MsgType>_> *this)

{
  int iVar1;
  
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)&this->queue_mtx_);
  if (iVar1 == 0) {
    std::
    deque<blcl::net::owned_message<MsgType>,_std::allocator<blcl::net::owned_message<MsgType>_>_>::
    clear(&this->raw_deque_);
    pthread_mutex_unlock((pthread_mutex_t *)&this->queue_mtx_);
    return;
  }
  std::__throw_system_error(iVar1);
}

Assistant:

void clear() {
            std::scoped_lock lock(queue_mtx_);
            raw_deque_.clear();
        }